

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

type __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
operator()(arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,double value)

{
  long in_RDI;
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_XMM0_Qa;
  iterator iVar1;
  type tVar2;
  format_specs *in_stack_000002b0;
  double in_stack_000002b8;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_000002c0;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    basic_format_specs<char>::basic_format_specs((basic_format_specs<char> *)in_XMM0_Qa);
  }
  basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::
  write_double<double>(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0);
  iVar1 = arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
          ::out(in_XMM0_Qa);
  tVar2.count_ = iVar1.count_;
  tVar2.blackhole_ = iVar1.blackhole_;
  tVar2._9_7_ = iVar1._9_7_;
  return tVar2;
}

Assistant:

typename std::enable_if<std::is_floating_point<T>::value, iterator>::type
      operator()(T value) {
    writer_.write_double(value, specs_ ? *specs_ : format_specs());
    return out();
  }